

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5cmp.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  char buf [65];
  
  if (argc < 3) {
    fprintf(_stderr,"USAGE: %s <correct MD5 sum> <file>\n",*argv);
  }
  else {
    sVar2 = strlen(argv[1]);
    if (sVar2 != 0x20) {
      fwrite("WARNING: MD5 hash size is wrong.\n",0x21,1,_stderr);
    }
    __s1 = MD5File(argv[2],buf);
    if (__s1 == (char *)0x0) {
      perror("Could not obtain MD5 sum");
    }
    else {
      iVar1 = strcasecmp(__s1,argv[1]);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s: OK\n",argv[2]);
        return 0;
      }
      fprintf(_stderr,"%s: FAILED.  Checksum is %s\n",argv[2],__s1);
    }
  }
  return -1;
}

Assistant:

int main(int argc, char *argv[])
{
  char *md5sum = NULL, buf[65];

  if (argc < 3) {
    fprintf(stderr, "USAGE: %s <correct MD5 sum> <file>\n", argv[0]);
    return -1;
  }

  if (strlen(argv[1]) != 32)
    fprintf(stderr, "WARNING: MD5 hash size is wrong.\n");

  md5sum = MD5File(argv[2], buf);
  if (!md5sum) {
    perror("Could not obtain MD5 sum");
    return -1;
  }

  if (!strcasecmp(md5sum, argv[1])) {
    fprintf(stderr, "%s: OK\n", argv[2]);
    return 0;
  } else {
    fprintf(stderr, "%s: FAILED.  Checksum is %s\n", argv[2], md5sum);
    return -1;
  }
}